

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  pointer pSVar1;
  long *plVar2;
  Expr<tcu::Vector<float,_3>_> *pEVar3;
  Interval *pIVar4;
  double dVar5;
  undefined7 uVar6;
  IVal *pIVar7;
  IVal *pIVar8;
  size_t ndx;
  ulong uVar9;
  double *pdVar10;
  IRet *pIVar11;
  Vector<tcu::Interval,_3> *pVVar12;
  long lVar13;
  byte bVar14;
  Environment funEnv;
  EvalContext funCtx;
  double local_78 [9];
  
  bVar14 = 0;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  initialize(this);
  Environment::bind<tcu::Vector<float,3>>
            (&funEnv,(this->m_var0).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                     .m_ptr,args->a);
  Environment::bind<tcu::Vector<float,3>>
            (&funEnv,(this->m_var1).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                     .m_ptr,args->b);
  Environment::bind<float>
            (&funEnv,(this->m_var2).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr
             ,args->c);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            (&funEnv,(this->m_var3).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                     .m_ptr,args->d);
  funCtx.floatPrecision = ctx->floatPrecision;
  funCtx.callDepth = ctx->callDepth;
  funCtx.format.m_maxValue = (ctx->format).m_maxValue;
  funCtx.format.m_minExp = (ctx->format).m_minExp;
  funCtx.format.m_maxExp = (ctx->format).m_maxExp;
  funCtx.format.m_fractionBits = (ctx->format).m_fractionBits;
  funCtx.format.m_hasSubnormal = (ctx->format).m_hasSubnormal;
  funCtx.format.m_hasInf = (ctx->format).m_hasInf;
  funCtx.format.m_hasNaN = (ctx->format).m_hasNaN;
  funCtx.format.m_exactPrecision = (ctx->format).m_exactPrecision;
  funCtx.format._25_7_ = *(undefined7 *)&(ctx->format).field_0x19;
  lVar13 = 0;
  uVar9 = 0;
  funCtx.env = &funEnv;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar9)
    break;
    plVar2 = *(long **)((long)&(pSVar1->
                               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).
                               m_ptr + lVar13);
    (**(code **)(*plVar2 + 0x18))(plVar2,&funCtx);
    uVar9 = uVar9 + 1;
    lVar13 = lVar13 + 0x10;
  }
  pEVar3 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
           super_ExprPBase<tcu::Vector<float,_3>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.
           m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(local_78,pEVar3,&funCtx);
  pdVar10 = local_78;
  pIVar11 = __return_storage_ptr__;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *(double *)pIVar11->m_data = *pdVar10;
    pdVar10 = pdVar10 + (ulong)bVar14 * -2 + 1;
    pIVar11 = (IRet *)((long)pIVar11 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pIVar7 = Environment::lookup<tcu::Vector<float,3>>
                     (&funEnv,(this->m_var0).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                              .m_ptr);
  pVVar12 = args->a;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar6 = *(undefined7 *)&pIVar7->m_data[0].field_0x1;
    pVVar12->m_data[0].m_hasNaN = pIVar7->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar12->m_data[0].field_0x1 = uVar6;
    pIVar7 = (IVal *)((long)pIVar7 + ((ulong)bVar14 * -2 + 1) * 8);
    pVVar12 = (Vector<tcu::Interval,_3> *)((long)pVVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pIVar7 = Environment::lookup<tcu::Vector<float,3>>
                     (&funEnv,(this->m_var1).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                              .m_ptr);
  pVVar12 = args->b;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar6 = *(undefined7 *)&pIVar7->m_data[0].field_0x1;
    pVVar12->m_data[0].m_hasNaN = pIVar7->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar12->m_data[0].field_0x1 = uVar6;
    pIVar7 = (IVal *)((long)pIVar7 + ((ulong)bVar14 * -2 + 1) * 8);
    pVVar12 = (Vector<tcu::Interval,_3> *)((long)pVVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pIVar8 = Environment::lookup<float>
                     (&funEnv,(this->m_var2).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                              .m_ptr);
  pIVar4 = args->c;
  pIVar4->m_hi = pIVar8->m_hi;
  uVar6 = *(undefined7 *)&pIVar8->field_0x1;
  dVar5 = pIVar8->m_lo;
  pIVar4->m_hasNaN = pIVar8->m_hasNaN;
  *(undefined7 *)&pIVar4->field_0x1 = uVar6;
  pIVar4->m_lo = dVar5;
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            (&funEnv,(this->m_var3).
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                     .m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&funEnv);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}